

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

iterator __thiscall
cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate
          (cmLinkedTree<cmStateDetail::SnapshotDataType> *this)

{
  pointer puVar1;
  pointer pSVar2;
  pointer puVar3;
  pointer pSVar4;
  iterator iVar5;
  
  puVar3 = (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 == puVar1) {
    __assert_fail("!this->UpPositions.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0xa0,
                  "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate() [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  puVar3 = puVar3 + 1;
  if (puVar3 != puVar1) {
    (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pSVar4 = (this->Data).
           super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->Data).
           super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar4 != pSVar2) {
    pSVar4 = pSVar4 + 1;
    if (pSVar4 != pSVar2) {
      (this->Data).
      super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar4;
    }
    iVar5.Position = 1;
    iVar5.Tree = this;
    return iVar5;
  }
  __assert_fail("!this->Data.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                ,0xa3,
                "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate() [T = cmStateDetail::SnapshotDataType]"
               );
}

Assistant:

iterator Truncate()
  {
    assert(!this->UpPositions.empty());
    this->UpPositions.erase(this->UpPositions.begin() + 1,
                            this->UpPositions.end());
    assert(!this->Data.empty());
    this->Data.erase(this->Data.begin() + 1, this->Data.end());
    return iterator(this, 1);
  }